

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Status coda_XML_SetEncoding(XML_Parser parser,XML_Char *encodingName)

{
  char *pcVar1;
  XML_Char *__dest;
  XML_Status XVar2;
  size_t charsRequired;
  size_t __n;
  
  XVar2 = XML_STATUS_ERROR;
  if ((parser != (XML_Parser)0x0) &&
     (XVar2 = XML_STATUS_ERROR, ((parser->m_parsingStatus).parsing | XML_FINISHED) != XML_SUSPENDED)
     ) {
    (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
    XVar2 = XML_STATUS_OK;
    if (encodingName == (XML_Char *)0x0) {
      __dest = (XML_Char *)0x0;
    }
    else {
      __n = 0;
      do {
        pcVar1 = encodingName + __n;
        __n = __n + 1;
      } while (*pcVar1 != '\0');
      __dest = (XML_Char *)(*(parser->m_mem).malloc_fcn)(__n);
      if (__dest == (XML_Char *)0x0) {
        __dest = (XML_Char *)0x0;
        XVar2 = XML_STATUS_ERROR;
      }
      else {
        memcpy(__dest,encodingName,__n);
      }
    }
    parser->m_protocolEncodingName = __dest;
  }
  return XVar2;
}

Assistant:

enum XML_Status XMLCALL
XML_SetEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser == NULL)
    return XML_STATUS_ERROR;
  /* Block after XML_Parse()/XML_ParseBuffer() has been called.
     XXX There's no way for the caller to determine which of the
     XXX possible error cases caused the XML_STATUS_ERROR return.
  */
  if (parser->m_parsingStatus.parsing == XML_PARSING
      || parser->m_parsingStatus.parsing == XML_SUSPENDED)
    return XML_STATUS_ERROR;

  /* Get rid of any previous encoding name */
  FREE(parser, (void *)parser->m_protocolEncodingName);

  if (encodingName == NULL)
    /* No new encoding name */
    parser->m_protocolEncodingName = NULL;
  else {
    /* Copy the new encoding name into allocated memory */
    parser->m_protocolEncodingName = copyString(encodingName, &(parser->m_mem));
    if (! parser->m_protocolEncodingName)
      return XML_STATUS_ERROR;
  }
  return XML_STATUS_OK;
}